

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O3

REF_STATUS ref_geom_enrich2(REF_GRID ref_grid)

{
  size_t __size;
  REF_MPI pRVar1;
  REF_NODE ref_node;
  uint uVar2;
  REF_STATUS RVar3;
  void *__s;
  undefined8 uVar4;
  REF_EDGE ref_edge_00;
  REF_CELL pRVar5;
  char *pcVar6;
  REF_INT RVar7;
  int iVar8;
  REF_EDGE ref_edge;
  REF_INT new_cell;
  REF_INT node;
  REF_INT part;
  REF_INT nodes [27];
  REF_GLOB global;
  REF_INT local_c4;
  REF_EDGE local_c0;
  REF_INT local_b4;
  REF_INT local_b0;
  int local_ac;
  REF_INT local_a8 [4];
  undefined4 local_98;
  undefined4 local_94;
  undefined4 local_90;
  undefined4 local_8c;
  undefined4 local_88;
  undefined4 local_84;
  REF_GLOB local_38;
  
  pRVar1 = ref_grid->mpi;
  ref_node = ref_grid->node;
  uVar2 = ref_node_synchronize_globals(ref_node);
  if (uVar2 == 0) {
    uVar2 = ref_geom_constrain_all(ref_grid);
    if (uVar2 == 0) {
      uVar2 = ref_edge_create(&local_c0,ref_grid);
      ref_edge_00 = local_c0;
      if (uVar2 == 0) {
        iVar8 = local_c0->n;
        if ((long)iVar8 < 0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                 0xfb4,"ref_geom_enrich2","malloc edge_node of REF_INT negative");
          return 1;
        }
        __size = (long)iVar8 * 4;
        __s = malloc(__size);
        if (__s == (void *)0x0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                 0xfb4,"ref_geom_enrich2","malloc edge_node of REF_INT NULL");
          return 2;
        }
        if (iVar8 != 0) {
          memset(__s,0xff,__size);
        }
        local_c4 = 0;
        if (0 < ref_edge_00->n) {
          do {
            uVar2 = ref_edge_part(ref_edge_00,local_c4,&local_ac);
            if (uVar2 != 0) {
              pcVar6 = "edge part";
              uVar4 = 0xfb6;
              goto LAB_00154e98;
            }
            if (pRVar1->id == local_ac) {
              uVar2 = ref_node_next_global(ref_node,&local_38);
              if (uVar2 != 0) {
                pcVar6 = "next global";
                uVar4 = 0xfb8;
                goto LAB_00154e98;
              }
              uVar2 = ref_node_add(ref_node,local_38,&local_b0);
              if (uVar2 != 0) {
                pcVar6 = "add node";
                uVar4 = 0xfb9;
                goto LAB_00154e98;
              }
              *(REF_INT *)((long)__s + (long)local_c4 * 4) = local_b0;
              uVar2 = ref_node_interpolate_edge
                                (ref_node,local_c0->e2n[(long)local_c4 * 2],
                                 local_c0->e2n[local_c4 * 2 + 1],0.5,local_b0);
              if (uVar2 != 0) {
                pcVar6 = "new reals";
                uVar4 = 0xfbd;
                goto LAB_00154e98;
              }
              uVar2 = ref_geom_add_constrain_midnode
                                (ref_grid,local_c0->e2n[(long)local_c4 * 2],
                                 local_c0->e2n[local_c4 * 2 + 1],0.5,local_b0);
              if (uVar2 != 0) {
                pcVar6 = "new geom";
                uVar4 = 0xfc1;
                goto LAB_00154e98;
              }
            }
            local_c4 = local_c4 + 1;
            ref_edge_00 = local_c0;
          } while (local_c4 < local_c0->n);
        }
        uVar2 = ref_node_shift_new_globals(ref_node);
        if (uVar2 == 0) {
          pRVar5 = ref_grid->cell[0];
          if (0 < pRVar5->max) {
            RVar7 = 0;
            do {
              RVar3 = ref_cell_nodes(pRVar5,RVar7,local_a8);
              if (RVar3 == 0) {
                local_a8[ref_grid->cell[1]->node_per] = local_a8[ref_grid->cell[0]->node_per];
                uVar2 = ref_edge_with(local_c0,local_a8[0],local_a8[1],&local_c4);
                if (uVar2 != 0) {
                  pcVar6 = "find edge01";
                  uVar4 = 0xfca;
                  goto LAB_00154e98;
                }
                local_a8[2] = *(REF_INT *)((long)__s + (long)local_c4 * 4);
                uVar2 = ref_cell_add(ref_grid->cell[1],local_a8,&local_b4);
                if (uVar2 != 0) {
                  pcVar6 = "add";
                  uVar4 = 0xfcc;
                  goto LAB_00154e98;
                }
              }
              RVar7 = RVar7 + 1;
              pRVar5 = ref_grid->cell[0];
            } while (RVar7 < pRVar5->max);
          }
          pRVar5 = ref_grid->cell[3];
          if (0 < pRVar5->max) {
            RVar7 = 0;
            do {
              RVar3 = ref_cell_nodes(pRVar5,RVar7,local_a8);
              if (RVar3 == 0) {
                local_a8[ref_grid->cell[4]->node_per] = local_a8[ref_grid->cell[3]->node_per];
                uVar2 = ref_edge_with(local_c0,local_a8[0],local_a8[1],&local_c4);
                if (uVar2 != 0) {
                  pcVar6 = "find edge01";
                  uVar4 = 0xfd2;
                  goto LAB_00154e98;
                }
                local_a8[3] = *(REF_INT *)((long)__s + (long)local_c4 * 4);
                uVar2 = ref_edge_with(local_c0,local_a8[1],local_a8[2],&local_c4);
                if (uVar2 != 0) {
                  pcVar6 = "find edge12";
                  uVar4 = 0xfd4;
                  goto LAB_00154e98;
                }
                local_98 = *(undefined4 *)((long)__s + (long)local_c4 * 4);
                uVar2 = ref_edge_with(local_c0,local_a8[2],local_a8[0],&local_c4);
                if (uVar2 != 0) {
                  pcVar6 = "find edge20";
                  uVar4 = 0xfd6;
                  goto LAB_00154e98;
                }
                local_94 = *(undefined4 *)((long)__s + (long)local_c4 * 4);
                uVar2 = ref_cell_add(ref_grid->cell[4],local_a8,&local_b4);
                if (uVar2 != 0) {
                  pcVar6 = "add";
                  uVar4 = 0xfd8;
                  goto LAB_00154e98;
                }
              }
              RVar7 = RVar7 + 1;
              pRVar5 = ref_grid->cell[3];
            } while (RVar7 < pRVar5->max);
          }
          pRVar5 = ref_grid->cell[8];
          if (0 < pRVar5->max) {
            iVar8 = 0;
            do {
              RVar3 = ref_cell_nodes(pRVar5,iVar8,local_a8);
              if (RVar3 == 0) {
                uVar2 = ref_edge_with(local_c0,local_a8[0],local_a8[1],&local_c4);
                if (uVar2 != 0) {
                  pcVar6 = "find edge";
                  uVar4 = 0xfdb;
                  goto LAB_00154e98;
                }
                local_98 = *(undefined4 *)((long)__s + (long)local_c4 * 4);
                uVar2 = ref_edge_with(local_c0,local_a8[1],local_a8[2],&local_c4);
                if (uVar2 != 0) {
                  pcVar6 = "find edge";
                  uVar4 = 0xfdd;
                  goto LAB_00154e98;
                }
                local_94 = *(undefined4 *)((long)__s + (long)local_c4 * 4);
                uVar2 = ref_edge_with(local_c0,local_a8[0],local_a8[2],&local_c4);
                if (uVar2 != 0) {
                  pcVar6 = "find edge";
                  uVar4 = 0xfdf;
                  goto LAB_00154e98;
                }
                local_90 = *(undefined4 *)((long)__s + (long)local_c4 * 4);
                uVar2 = ref_edge_with(local_c0,local_a8[0],local_a8[3],&local_c4);
                if (uVar2 != 0) {
                  pcVar6 = "find edge";
                  uVar4 = 0xfe1;
                  goto LAB_00154e98;
                }
                local_8c = *(undefined4 *)((long)__s + (long)local_c4 * 4);
                uVar2 = ref_edge_with(local_c0,local_a8[1],local_a8[3],&local_c4);
                if (uVar2 != 0) {
                  pcVar6 = "find edge";
                  uVar4 = 0xfe3;
                  goto LAB_00154e98;
                }
                local_88 = *(undefined4 *)((long)__s + (long)local_c4 * 4);
                uVar2 = ref_edge_with(local_c0,local_a8[2],local_a8[3],&local_c4);
                if (uVar2 != 0) {
                  pcVar6 = "find edge";
                  uVar4 = 0xfe5;
                  goto LAB_00154e98;
                }
                local_84 = *(undefined4 *)((long)__s + (long)local_c4 * 4);
                uVar2 = ref_cell_add(ref_grid->cell[0xc],local_a8,&local_b4);
                if (uVar2 != 0) {
                  pcVar6 = "add";
                  uVar4 = 0xfe7;
                  goto LAB_00154e98;
                }
              }
              iVar8 = iVar8 + 1;
              pRVar5 = ref_grid->cell[8];
            } while (iVar8 < pRVar5->max);
          }
          free(__s);
          uVar2 = ref_edge_free(local_c0);
          if (uVar2 == 0) {
            pRVar5 = ref_grid->cell[0];
            if (0 < pRVar5->max) {
              RVar7 = 0;
              do {
                if (pRVar5->c2n[(long)RVar7 * (long)pRVar5->size_per] != -1) {
                  ref_cell_remove(pRVar5,RVar7);
                  pRVar5 = ref_grid->cell[0];
                }
                RVar7 = RVar7 + 1;
              } while (RVar7 < pRVar5->max);
            }
            pRVar5 = ref_grid->cell[3];
            if (0 < pRVar5->max) {
              RVar7 = 0;
              do {
                if (pRVar5->c2n[(long)RVar7 * (long)pRVar5->size_per] != -1) {
                  ref_cell_remove(pRVar5,RVar7);
                  pRVar5 = ref_grid->cell[3];
                }
                RVar7 = RVar7 + 1;
              } while (RVar7 < pRVar5->max);
            }
            pRVar5 = ref_grid->cell[8];
            if (0 < pRVar5->max) {
              iVar8 = 0;
              do {
                if (pRVar5->c2n[(long)iVar8 * (long)pRVar5->size_per] != -1) {
                  ref_cell_remove(pRVar5,iVar8);
                  pRVar5 = ref_grid->cell[8];
                }
                iVar8 = iVar8 + 1;
              } while (iVar8 < pRVar5->max);
              return 0;
            }
            return 0;
          }
          pcVar6 = "free edge";
          uVar4 = 0xfeb;
        }
        else {
          pcVar6 = "shift glob";
          uVar4 = 0xfc5;
        }
      }
      else {
        pcVar6 = "edge";
        uVar4 = 0xfb3;
      }
    }
    else {
      pcVar6 = "constrain";
      uVar4 = 0xfb1;
    }
  }
  else {
    pcVar6 = "sync glob";
    uVar4 = 0xfaf;
  }
LAB_00154e98:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",uVar4,
         "ref_geom_enrich2",(ulong)uVar2,pcVar6);
  return uVar2;
}

Assistant:

REF_FCN REF_STATUS ref_geom_enrich2(REF_GRID ref_grid) {
  REF_MPI ref_mpi = ref_grid_mpi(ref_grid);
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_EDGE ref_edge;
  REF_INT edge, *edge_node, part, node;
  REF_GLOB global;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT cell, new_cell;

  RSS(ref_node_synchronize_globals(ref_node), "sync glob");

  RSS(ref_geom_constrain_all(ref_grid), "constrain");

  RSS(ref_edge_create(&ref_edge, ref_grid), "edge");
  ref_malloc_init(edge_node, ref_edge_n(ref_edge), REF_INT, REF_EMPTY);
  for (edge = 0; edge < ref_edge_n(ref_edge); edge++) {
    RSS(ref_edge_part(ref_edge, edge, &part), "edge part");
    if (ref_mpi_rank(ref_mpi) == part) {
      RSS(ref_node_next_global(ref_node, &global), "next global");
      RSS(ref_node_add(ref_node, global, &node), "add node");
      edge_node[edge] = node;
      RSS(ref_node_interpolate_edge(ref_node, ref_edge_e2n(ref_edge, 0, edge),
                                    ref_edge_e2n(ref_edge, 1, edge), 0.5, node),
          "new reals");
      RSS(ref_geom_add_constrain_midnode(
              ref_grid, ref_edge_e2n(ref_edge, 0, edge),
              ref_edge_e2n(ref_edge, 1, edge), 0.5, node),
          "new geom");
    }
  }

  RSS(ref_node_shift_new_globals(ref_node), "shift glob");

  each_ref_cell_valid_cell_with_nodes(ref_grid_edg(ref_grid), cell, nodes) {
    nodes[ref_cell_id_index(ref_grid_ed2(ref_grid))] =
        nodes[ref_cell_id_index(ref_grid_edg(ref_grid))];
    RSS(ref_edge_with(ref_edge, nodes[0], nodes[1], &edge), "find edge01");
    nodes[2] = edge_node[edge];
    RSS(ref_cell_add(ref_grid_ed2(ref_grid), nodes, &new_cell), "add");
  }

  each_ref_cell_valid_cell_with_nodes(ref_grid_tri(ref_grid), cell, nodes) {
    nodes[ref_cell_id_index(ref_grid_tr2(ref_grid))] =
        nodes[ref_cell_id_index(ref_grid_tri(ref_grid))];
    RSS(ref_edge_with(ref_edge, nodes[0], nodes[1], &edge), "find edge01");
    nodes[3] = edge_node[edge];
    RSS(ref_edge_with(ref_edge, nodes[1], nodes[2], &edge), "find edge12");
    nodes[4] = edge_node[edge];
    RSS(ref_edge_with(ref_edge, nodes[2], nodes[0], &edge), "find edge20");
    nodes[5] = edge_node[edge];
    RSS(ref_cell_add(ref_grid_tr2(ref_grid), nodes, &new_cell), "add");
  }
  each_ref_cell_valid_cell_with_nodes(ref_grid_tet(ref_grid), cell, nodes) {
    RSS(ref_edge_with(ref_edge, nodes[0], nodes[1], &edge), "find edge");
    nodes[4] = edge_node[edge];
    RSS(ref_edge_with(ref_edge, nodes[1], nodes[2], &edge), "find edge");
    nodes[5] = edge_node[edge];
    RSS(ref_edge_with(ref_edge, nodes[0], nodes[2], &edge), "find edge");
    nodes[6] = edge_node[edge];
    RSS(ref_edge_with(ref_edge, nodes[0], nodes[3], &edge), "find edge");
    nodes[7] = edge_node[edge];
    RSS(ref_edge_with(ref_edge, nodes[1], nodes[3], &edge), "find edge");
    nodes[8] = edge_node[edge];
    RSS(ref_edge_with(ref_edge, nodes[2], nodes[3], &edge), "find edge");
    nodes[9] = edge_node[edge];
    RSS(ref_cell_add(ref_grid_te2(ref_grid), nodes, &new_cell), "add");
  }

  ref_free(edge_node);
  RSS(ref_edge_free(ref_edge), "free edge");

  each_ref_cell_valid_cell(ref_grid_edg(ref_grid), cell) {
    ref_cell_remove(ref_grid_edg(ref_grid), cell);
  }
  each_ref_cell_valid_cell(ref_grid_tri(ref_grid), cell) {
    ref_cell_remove(ref_grid_tri(ref_grid), cell);
  }
  each_ref_cell_valid_cell(ref_grid_tet(ref_grid), cell) {
    ref_cell_remove(ref_grid_tet(ref_grid), cell);
  }

  return REF_SUCCESS;
}